

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O1

apx_error_t run_array_next(apx_vm_t *self)

{
  _Bool _Var1;
  int iVar2;
  _Bool is_last_index;
  _Bool local_9;
  
  local_9 = false;
  if ((self->program_header).program_type == '\x01') {
    iVar2 = apx_vm_serializer_array_next(&self->serializer,&local_9);
  }
  else {
    iVar2 = apx_vm_deserializer_array_next(&self->deserializer,&local_9);
  }
  if ((iVar2 == 0) && (iVar2 = 0, local_9 == false)) {
    _Var1 = apx_vm_decoder_has_saved_program_position(&self->decoder);
    iVar2 = 0x30;
    if (_Var1) {
      apx_vm_decoder_recall_program_position(&self->decoder);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static apx_error_t run_array_next(apx_vm_t* self)
{
   bool is_last_index = false;
   apx_error_t result = APX_NO_ERROR;
   if (is_pack_prog(self))
   {
      result = apx_vm_serializer_array_next(&self->serializer, &is_last_index);
   }
   else
   {
      result = apx_vm_deserializer_array_next(&self->deserializer, &is_last_index);
   }
   if (result != APX_NO_ERROR)
   {
      return result;
   }
   if (!is_last_index)
   {
      if (apx_vm_decoder_has_saved_program_position(&self->decoder))
      {
         apx_vm_decoder_recall_program_position(&self->decoder);
      }
      else
      {
         return APX_INVALID_INSTRUCTION_ERROR;
      }
   }
   return APX_NO_ERROR;
}